

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp9d_parser.c
# Opt level: O2

MPP_RET vp9d_paser_reset(Vp9CodecContext *ctx)

{
  VP9Context *s;
  void *pvVar1;
  undefined8 *puVar2;
  long lVar3;
  VP9Frame *pVVar4;
  bool bVar5;
  
  s = (VP9Context *)ctx->priv_data;
  pvVar1 = ctx->priv_data2;
  puVar2 = *(undefined8 **)((long)pvVar1 + 0x58);
  s->got_keyframes = 0;
  s->cur_poc = 0;
  pVVar4 = s->frames;
  lVar3 = 3;
  while (bVar5 = lVar3 != 0, lVar3 = lVar3 + -1, bVar5) {
    if (pVVar4->ref != (RefInfo *)0x0) {
      vp9_unref_frame(s,pVVar4);
    }
    pVVar4 = pVVar4 + 1;
  }
  pVVar4 = s->refs;
  lVar3 = 8;
  while (bVar5 = lVar3 != 0, lVar3 = lVar3 + -1, bVar5) {
    if (pVVar4->ref != (RefInfo *)0x0) {
      vp9_unref_frame(s,pVVar4);
    }
    pVVar4 = pVVar4 + 1;
  }
  puVar2[4] = 0;
  puVar2[5] = 0;
  puVar2[2] = 0;
  puVar2[3] = 0;
  *puVar2 = 0;
  puVar2[1] = 0;
  s->eos = 0;
  if (pvVar1 != (void *)0x0) {
    *(undefined4 *)((long)pvVar1 + 0x104) = 0;
  }
  return MPP_OK;
}

Assistant:

MPP_RET vp9d_paser_reset(Vp9CodecContext *ctx)
{
    RK_S32 i;
    VP9Context *s = ctx->priv_data;
    SplitContext_t *ps = (SplitContext_t *)ctx->priv_data2;
    VP9ParseContext *pc = (VP9ParseContext *)ps->priv_data;

    s->got_keyframes = 0;
    s->cur_poc = 0;
    for (i = 0; i < 3; i++) {
        if (s->frames[i].ref) {
            vp9_unref_frame(s, &s->frames[i]);
        }
    }
    for (i = 0; i < 8; i++) {
        if (s->refs[i].ref) {
            vp9_unref_frame(s, &s->refs[i]);
        }
    }
    memset(pc, 0, sizeof(VP9ParseContext));

    s->eos = 0;
    if (ps) {
        ps->eos = 0;
    }
    return MPP_OK;
}